

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

void __thiscall ON_BinaryArchive::~ON_BinaryArchive(ON_BinaryArchive *this)

{
  ON__3dmV1LayerIndex *pOVar1;
  ON_3dmTableStatusLink *pOVar2;
  ON_3dmTableStatusLink *pOVar3;
  ON_DimStyle *pOVar4;
  ON_3dmProperties *this_00;
  ON_3dmSettings *this_01;
  ON_TextStyle *pOVar5;
  int iVar6;
  ON__3dmV1LayerIndex *memblock;
  long lVar7;
  uint uVar8;
  bool bVar9;
  
  this->_vptr_ON_BinaryArchive = (_func_int **)&PTR__ON_BinaryArchive_0080ab28;
  memblock = this->m_V1_layer_list;
  if (memblock != (ON__3dmV1LayerIndex *)0x0) {
    this->m_V1_layer_list = (ON__3dmV1LayerIndex *)0x0;
    uVar8 = 0;
    do {
      pOVar1 = memblock->m_next;
      onfree(memblock);
      if (pOVar1 == (ON__3dmV1LayerIndex *)0x0) break;
      bVar9 = uVar8 < 999;
      memblock = pOVar1;
      uVar8 = uVar8 + 1;
    } while (bVar9);
  }
  if (this->m_compressor != (ON_CompressorImplementation *)0x0) {
    CompressionEnd(this);
    onfree(this->m_compressor);
  }
  pOVar2 = this->m_3dm_table_status_list;
  this->m_3dm_table_status_list = (ON_3dmTableStatusLink *)0x0;
  while (pOVar2 != (ON_3dmTableStatusLink *)0x0) {
    pOVar3 = pOVar2->m_next;
    operator_delete(pOVar2,0x20);
    pOVar2 = pOVar3;
  }
  pOVar4 = (this->m_annotation_context).m_managed_parent_dim_style;
  if (pOVar4 != (ON_DimStyle *)0x0) {
    (*(pOVar4->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
    (this->m_annotation_context).m_managed_parent_dim_style = (ON_DimStyle *)0x0;
  }
  pOVar4 = (this->m_annotation_context).m_managed_override_dim_style;
  if (pOVar4 != (ON_DimStyle *)0x0) {
    (*(pOVar4->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
    (this->m_annotation_context).m_managed_override_dim_style = (ON_DimStyle *)0x0;
  }
  (this->m_annotation_context).m_parent_dim_style = (ON_DimStyle *)0x0;
  (this->m_annotation_context).m_override_dim_style = (ON_DimStyle *)0x0;
  (this->m_annotation_context).m_V5_3dm_archive_dim_style_index = -0x7fffffff;
  this_00 = this->m_archive_3dm_properties;
  if (this_00 != (ON_3dmProperties *)0x0) {
    ON_3dmProperties::~ON_3dmProperties(this_00);
    operator_delete(this_00,0x228);
    this->m_archive_3dm_properties = (ON_3dmProperties *)0x0;
  }
  this_01 = this->m_archive_3dm_settings;
  if (this_01 != (ON_3dmSettings *)0x0) {
    ON_3dmSettings::~ON_3dmSettings(this_01);
    operator_delete(this_01,0x618);
    this->m_archive_3dm_settings = (ON_3dmSettings *)0x0;
  }
  iVar6 = (this->m_archive_text_style_table).m_count;
  if (0 < iVar6) {
    lVar7 = 0;
    do {
      pOVar5 = (this->m_archive_text_style_table).m_a[lVar7];
      if (pOVar5 != (ON_TextStyle *)0x0) {
        (*(pOVar5->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
        iVar6 = (this->m_archive_text_style_table).m_count;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar6);
  }
  ON_SimpleArray<ON_TextStyle_*>::SetCapacity(&this->m_archive_text_style_table,0);
  iVar6 = (this->m_archive_dim_style_table).m_count;
  if (0 < iVar6) {
    lVar7 = 0;
    do {
      pOVar4 = (this->m_archive_dim_style_table).m_a[lVar7];
      if (pOVar4 != (ON_DimStyle *)0x0) {
        (*(pOVar4->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
        iVar6 = (this->m_archive_dim_style_table).m_count;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar6);
  }
  ON_SimpleArray<ON_DimStyle_*>::SetCapacity(&this->m_archive_dim_style_table,0);
  ON_String::~ON_String(&this->m_archive_3dm_start_section_comment);
  ON_SimpleArray<ON_DimStyle_*>::~ON_SimpleArray(&this->m_DELETE_ME_archive_dim_style_overrides);
  ON_SimpleArray<ON_DimStyle_*>::~ON_SimpleArray(&this->m_archive_dim_style_table);
  ON_SimpleArray<ON_2dex>::~ON_SimpleArray(&this->m_text_style_to_dim_style_archive_index_map);
  ON_SimpleArray<ON_TextStyle_*>::~ON_SimpleArray(&this->m_archive_text_style_table);
  ON_3dmAnnotationContext::~ON_3dmAnnotationContext(&this->m_annotation_context);
  ON_SimpleArray<ON_UUID_struct>::~ON_SimpleArray(&this->m_V3_plugin_id_list);
  ON_wString::~ON_wString(&this->m_archive_saved_as_full_path);
  ON_wString::~ON_wString(&this->m_archive_full_path);
  ON_wString::~ON_wString(&this->m_archive_directory_name);
  ON_wString::~ON_wString(&this->m_archive_file_name);
  ON_ManifestMap::~ON_ManifestMap(&this->m_manifest_map);
  ON_ComponentManifest::~ON_ComponentManifest(&this->m_manifest);
  ON_SimpleArray<ON_UserDataItemFilter>::~ON_SimpleArray(&this->m_user_data_filter);
  ON_SimpleArray<ON_3DM_BIG_CHUNK>::~ON_SimpleArray(&this->m_chunk);
  return;
}

Assistant:

ON_BinaryArchive::~ON_BinaryArchive()
{
  if ( 0 != m_V1_layer_list )
  {
    struct ON__3dmV1LayerIndex* next = m_V1_layer_list;
    m_V1_layer_list = 0;
    for ( int i = 0; 0 != next && i < 1000; i++ )
    {
      struct ON__3dmV1LayerIndex* p = next;
      next = p->m_next;
      onfree(p);
    }
  }

  if (nullptr != m_compressor)
  {
    CompressionEnd();
    onfree(m_compressor);
  }

  ON_3dmTableStatusLink* next = m_3dm_table_status_list;
  m_3dm_table_status_list = nullptr;
  while (nullptr != next)
  {
    ON_3dmTableStatusLink* p = next;
    next = const_cast<ON_3dmTableStatusLink*>(next->m_next);
    delete p;
  }

  m_annotation_context.SetReferencedDimStyle(nullptr,nullptr,ON_UNSET_INT_INDEX);

  if (nullptr != m_archive_3dm_properties)
  {
    delete m_archive_3dm_properties;
    m_archive_3dm_properties = nullptr;
  }

  if (nullptr != m_archive_3dm_settings)
  {
    delete m_archive_3dm_settings;
    m_archive_3dm_settings = nullptr;
  }

  for (int i = 0; i < m_archive_text_style_table.Count(); i++)
  {
    if (nullptr != m_archive_text_style_table[i])
      delete m_archive_text_style_table[i];
  }
  m_archive_text_style_table.Destroy();

  for (int i = 0; i < m_archive_dim_style_table.Count(); i++)
  {
    if (nullptr != m_archive_dim_style_table[i])
      delete m_archive_dim_style_table[i];
  }
  m_archive_dim_style_table.Destroy();
}